

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

bool __thiscall
QPDFObjectHandle::isDictionaryOfType(QPDFObjectHandle *this,string *type,string *subtype)

{
  size_type sVar1;
  bool bVar2;
  allocator<char> local_82;
  allocator<char> local_81;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  string local_60 [32];
  string local_40 [32];
  
  bVar2 = isDictionary(this);
  if (!bVar2) {
    return false;
  }
  sVar1 = type->_M_string_length;
  if (sVar1 == 0) {
    if (subtype->_M_string_length == 0) {
      return true;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_40,"/Type",&local_81);
    getKey(&local_70,(string *)this);
    bVar2 = isNameAndEquals(&local_70,type);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_00198349;
    }
    if (subtype->_M_string_length == 0) {
      bVar2 = true;
      goto LAB_00198349;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/Subtype",&local_82);
  getKey(&local_80,(string *)this);
  bVar2 = isNameAndEquals(&local_80,subtype);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_60);
  if (sVar1 == 0) {
    return bVar2;
  }
LAB_00198349:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_70.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_40);
  return bVar2;
}

Assistant:

bool
QPDFObjectHandle::isDictionaryOfType(std::string const& type, std::string const& subtype) const
{
    return isDictionary() && (type.empty() || getKey("/Type").isNameAndEquals(type)) &&
        (subtype.empty() || getKey("/Subtype").isNameAndEquals(subtype));
}